

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O2

void __thiscall
MDIOAnalyzerResults::GenBubbleText
          (MDIOAnalyzerResults *this,U64 frame_index,DisplayBase display_base,bool tabular)

{
  char *pcVar1;
  DisplayBase display_base_00;
  MDIOAnalyzerResults *frame_00;
  char *pcVar2;
  char *pcVar3;
  Frame frame;
  Frame local_50 [32];
  undefined1 local_30;
  
  AnalyzerResults::ClearResultStrings();
  frame_00 = this;
  AnalyzerResults::GetFrame((ulonglong)local_50);
  switch(local_30) {
  case 0:
    pcVar1 = "22";
    goto LAB_001070c3;
  case 1:
    pcVar1 = "45";
LAB_001070c3:
    GenStartString(this,(Frame *)frame_00,pcVar1,tabular);
    break;
  case 2:
    pcVar3 = "Write";
    pcVar1 = "WR";
    pcVar2 = "W";
    goto LAB_00107100;
  case 3:
    pcVar3 = "Read";
    pcVar1 = "RD";
    pcVar2 = "R";
    goto LAB_00107100;
  case 4:
    pcVar3 = "Address";
    pcVar1 = "AD";
    pcVar2 = "A";
    goto LAB_00107100;
  case 5:
    pcVar3 = "Read-Increment-Address";
    pcVar1 = "RD +AD";
    pcVar2 = "R+A";
LAB_00107100:
    GenOpString(this,(Frame *)frame_00,pcVar2,pcVar1,pcVar3,tabular);
    break;
  case 6:
    GenPhyAddrString(this,local_50,display_base,tabular);
    break;
  case 7:
    GenC22RegAddrString(this,local_50,display_base,tabular);
    break;
  case 8:
    pcVar1 = "Reserved";
    goto LAB_0010716b;
  case 9:
    pcVar1 = "PMD/PMA";
    goto LAB_0010716b;
  case 10:
    pcVar1 = "WIS";
    goto LAB_0010716b;
  case 0xb:
    pcVar1 = "PCS";
    goto LAB_0010716b;
  case 0xc:
    pcVar1 = "PHY XS";
    goto LAB_0010716b;
  case 0xd:
    pcVar1 = "DTE XS";
    goto LAB_0010716b;
  case 0xe:
    pcVar1 = "Other";
LAB_0010716b:
    GenC45DevTypeString(this,local_50,display_base,pcVar1,tabular);
    break;
  case 0xf:
    GenTAString(this,local_50,display_base_00,tabular);
    break;
  case 0x10:
    GenC22DataString(this,local_50,display_base,tabular);
    break;
  case 0x11:
    pcVar3 = "Address";
    pcVar2 = "ADDR";
    pcVar1 = "A";
    goto LAB_00107142;
  case 0x12:
    pcVar3 = "Data";
    pcVar2 = "DATA";
    pcVar1 = "D";
LAB_00107142:
    GenC45AddrDataString(this,local_50,display_base,pcVar1,pcVar2,pcVar3,tabular);
    break;
  case 0x13:
    GenUnknownString(this,tabular);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenBubbleText( U64 frame_index, DisplayBase display_base, bool tabular )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    switch( frame.mType )
    {
    case MDIO_C22_START:
        GenStartString( frame, "22", tabular );
        break;
    case MDIO_C45_START:
        GenStartString( frame, "45", tabular );
        break;
    case MDIO_OP_W:
        GenOpString( frame, "W", "WR", "Write", tabular );
        break;
    case MDIO_OP_R:
        GenOpString( frame, "R", "RD", "Read", tabular );
        break;
    case MDIO_C45_OP_ADDR:
        GenOpString( frame, "A", "AD", "Address", tabular );
        break;
    case MDIO_C45_OP_READ_INC_ADDR:
        GenOpString( frame, "R+A", "RD +AD", "Read-Increment-Address", tabular );
        break;
    case MDIO_PHYADDR:
        GenPhyAddrString( frame, display_base, tabular );
        break;
    case MDIO_C22_REGADDR:
        GenC22RegAddrString( frame, display_base, tabular );
        break;
    case MDIO_C45_DEVTYPE_RESERVED:
        GenC45DevTypeString( frame, display_base, "Reserved", tabular );
        break;
    case MDIO_C45_DEVTYPE_PMD_PMA:
        GenC45DevTypeString( frame, display_base, "PMD/PMA", tabular );
        break;
    case MDIO_C45_DEVTYPE_WIS:
        GenC45DevTypeString( frame, display_base, "WIS", tabular );
        break;
    case MDIO_C45_DEVTYPE_PCS:
        GenC45DevTypeString( frame, display_base, "PCS", tabular );
        break;
    case MDIO_C45_DEVTYPE_PHY_XS:
        GenC45DevTypeString( frame, display_base, "PHY XS", tabular );
        break;
    case MDIO_C45_DEVTYPE_DTE_XS:
        GenC45DevTypeString( frame, display_base, "DTE XS", tabular );
        break;
    case MDIO_C45_DEVTYPE_OTHER:
        GenC45DevTypeString( frame, display_base, "Other", tabular );
        break;
    case MDIO_TA:
        GenTAString( frame, display_base, tabular );
        break;
    case MDIO_C22_DATA:
        GenC22DataString( frame, display_base, tabular );
        break;
    case MDIO_C45_ADDR:
        GenC45AddrDataString( frame, display_base, "A", "ADDR", "Address", tabular );
        break;
    case MDIO_C45_DATA:
        GenC45AddrDataString( frame, display_base, "D", "DATA", "Data", tabular );
        break;
    case MDIO_UNKNOWN:
        GenUnknownString( tabular );
        break;
    }
}